

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_slice<int,false,6>
          (immutable *this,ref<immutable::rrb<int,_false,_6>_> *rrb,uint32_t from,uint32_t to)

{
  ref<immutable::rrb<int,_false,_6>_> local_20;
  ref<immutable::rrb<int,_false,_6>_> local_18;
  
  local_20 = (ref<immutable::rrb<int,_false,_6>_>)rrb->ptr;
  if (local_20.ptr != (rrb<int,_false,_6> *)0x0) {
    (local_20.ptr)->_ref_count = (local_20.ptr)->_ref_count + 1;
  }
  rrb_details::rrb_drop_right<int,false,6>((rrb_details *)&local_18,&local_20,to);
  rrb_details::rrb_drop_left<int,false,6>((rrb_details *)this,&local_18,from);
  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_18);
  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_20);
  return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_slice(const ref<rrb<T, atomic_ref_counting, N>>& rrb, uint32_t from, uint32_t to)
    {
    using namespace rrb_details;
    return rrb_drop_left(rrb_drop_right(rrb, to), from);
    }